

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmw<unsigned_int,unsigned_char>
          (Thread *this,BinopFunc<unsigned_char,_unsigned_char> *f,Instr instr,Ptr *out_trap)

{
  byte bVar1;
  pointer puVar2;
  Store *this_00;
  Memory *pMVar3;
  uchar uVar4;
  RunResult RVar5;
  ulong uVar6;
  ulong uVar7;
  Value VVar8;
  Value VVar9;
  Value value;
  RefPtr<wabt::interp::Memory> local_98;
  BinopFunc<unsigned_char,_unsigned_char> *local_78;
  Ptr *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  local_78 = f;
  local_70 = out_trap;
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_98,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar8 = Pop(this);
  VVar9 = Pop(this);
  pMVar3 = local_98.obj_;
  uVar7 = (ulong)instr.field_2.imm_u32x2.snd;
  uVar6 = VVar9.i64_ & 0xffffffff;
  puVar2 = ((local_98.obj_)->data_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar7 + uVar6 <
      (ulong)((long)((local_98.obj_)->data_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2)) {
    bVar1 = puVar2[uVar7 + uVar6];
    value.i64_._1_7_ = 0;
    value.v128_.v[0] = bVar1;
    uVar4 = (*local_78)(bVar1,VVar8._0_1_);
    puVar2 = (pMVar3->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    value._8_8_ = (long)(pMVar3->data_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2;
    if (uVar7 + uVar6 < value._8_8_) {
      puVar2[uVar7 + uVar6] = uVar4;
      Push(this,value);
      RVar5 = Ok;
      goto LAB_00194e03;
    }
  }
  this_00 = this->store_;
  StringPrintf_abi_cxx11_(&local_68,"invalid atomic access at %u+%u",VVar9.i64_ & 0xffffffff,uVar7);
  Store::
  Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
            (&local_48,this_00,this_00,&local_68,&this->frames_);
  local_70->obj_ = local_48.obj_;
  local_70->store_ = local_48.store_;
  local_70->root_index_ = local_48.root_index_;
  local_48.obj_ = (Trap *)0x0;
  local_48.store_ = (Store *)0x0;
  local_48.root_index_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  RVar5 = Trap;
LAB_00194e03:
  if (local_98.obj_ != (Memory *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_98.store_)->roots_,local_98.root_index_);
  }
  return RVar5;
}

Assistant:

RunResult Thread::DoAtomicRmw(BinopFunc<T, T> f,
                              Instr instr,
                              Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  T val = Pop<T>();
  u32 offset = Pop<u32>();
  T old;
  TRAP_IF(Failed(memory->AtomicRmw(offset, instr.imm_u32x2.snd, val, f, &old)),
          StringPrintf("invalid atomic access at %u+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<R>(old));
  return RunResult::Ok;
}